

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceOfRevolution::IfcSurfaceOfRevolution
          (IfcSurfaceOfRevolution *this)

{
  *(undefined ***)&this->field_0x68 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcSurfaceOfRevolution";
  IfcSweptSurface::IfcSweptSurface
            (&this->super_IfcSweptSurface,&PTR_construction_vtable_24__0077d678);
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x58 = 0;
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x60 = 0;
  (this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x77d598;
  *(undefined8 *)&this->field_0x68 = 0x77d660;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x77d5c0;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x77d5e8;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30 =
       0x77d610;
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x50 = 0x77d638;
  return;
}

Assistant:

IfcSurfaceOfRevolution() : Object("IfcSurfaceOfRevolution") {}